

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

void Assimp::FBX::ParseVectorDataArray(vector<int,_std::allocator<int>_> *out,Element *el)

{
  Token *t;
  pointer ppTVar1;
  char *end;
  pointer pcVar2;
  int iVar3;
  size_t __n;
  Scope *sc;
  Element *pEVar4;
  Element *in_R9;
  pointer ppTVar5;
  long lVar6;
  char type;
  int32_t val;
  char *data;
  vector<char,_std::allocator<char>_> buff;
  uint32_t count;
  
  std::vector<int,_std::allocator<int>_>::resize(out,0);
  ppTVar5 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar5 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buff,"unexpected empty element",(allocator<char> *)&data);
    anon_unknown.dwarf_dd088f::ParseError((string *)&buff,el);
  }
  t = *ppTVar5;
  if (t->column == 0xffffffff) {
    data = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&data,end,&type,&count,el);
    if ((ulong)count != 0) {
      if (type != 'i') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buff,"expected int array (binary)",(allocator<char> *)&val);
        anon_unknown.dwarf_dd088f::ParseError((string *)&buff,el);
      }
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      anon_unknown_20::ReadBinaryDataArray('i',count,&data,end,&buff,in_R9);
      std::vector<int,_std::allocator<int>_>::reserve(out,(ulong)count);
      pcVar2 = buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar6 = 0; count != (uint32_t)lVar6; lVar6 = lVar6 + 1) {
        val = *(int32_t *)(pcVar2 + lVar6 * 4);
        std::vector<int,_std::allocator<int>_>::push_back(out,&val);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buff.super__Vector_base<char,_std::allocator<char>_>);
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<int,_std::allocator<int>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    std::__cxx11::string::string<std::allocator<char>>((string *)&buff,"a",(allocator<char> *)&data)
    ;
    pEVar4 = GetRequiredElement(sc,(string *)&buff,el);
    std::__cxx11::string::~string((string *)&buff);
    ppTVar1 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar5 = (pEVar4->tokens).
                   super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1;
        ppTVar5 = ppTVar5 + 1) {
      iVar3 = ParseTokenAsInt(*ppTVar5);
      buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)CONCAT44(buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,iVar3);
      std::vector<int,_std::allocator<int>_>::push_back(out,(value_type_conflict4 *)&buff);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<int>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'i') {
            ParseError("expected int array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * 4);

        out.reserve(count);

        const int32_t* ip = reinterpret_cast<const int32_t*>(&buff[0]);
        for (unsigned int i = 0; i < count; ++i, ++ip) {
            BE_NCONST int32_t val = *ip;
            AI_SWAP4(val);
            out.push_back(val);
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const int ival = ParseTokenAsInt(**it++);
        out.push_back(ival);
    }
}